

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<std::optional<unsigned_int>_()>::PerformDefaultAction
          (FunctionMocker<std::optional<unsigned_int>_()> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<std::optional<unsigned_int>_()> *this_00;
  Action<std::optional<unsigned_int>_()> *pAVar1;
  Result RVar2;
  optional<unsigned_int> oVar3;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<std::optional<unsigned_int>_()> *)0x0) {
    pAVar1 = OnCallSpec<std::optional<unsigned_int>_()>::GetAction(this_00);
    RVar2 = Action<std::optional<unsigned_int>_()>::Perform(pAVar1);
    return (Result)RVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>;
  }
  std::operator+(&bStack_28,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  oVar3 = DefaultValue<std::optional<unsigned_int>_>::Get();
  std::__cxx11::string::~string((string *)&bStack_28);
  return (Result)(_Optional_payload<unsigned_int,_true,_true,_true>)
                 oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }